

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_14::NameResolver::CheckDuplicateBindings
          (NameResolver *this,BindingHash *bindings,char *desc)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/resolve-names.cc:144:28)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/resolve-names.cc:144:28)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  local_28._8_8_ = desc;
  BindingHash::FindDuplicates(bindings,(DuplicateCallback *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void NameResolver::CheckDuplicateBindings(const BindingHash* bindings,
                                          const char* desc) {
  bindings->FindDuplicates([this, desc](const BindingHash::value_type& a,
                                        const BindingHash::value_type& b) {
    PrintDuplicateBindingsError(a, b, desc);
  });
}